

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ArgParams * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseParams
          (Parser *this,string *element_kind,bool *got_comma,Fodder *close_fodder)

{
  bool bVar1;
  reference pAVar2;
  undefined8 uVar3;
  StaticError *in_RSI;
  LocationRange *in_RDI;
  Var *pv;
  ArgParam *p;
  iterator __end3;
  iterator __begin3;
  ArgParams *__range3;
  Token paren_r;
  ArgParams *params;
  bool *in_stack_000004e0;
  string *in_stack_000004e8;
  ArgParams *in_stack_000004f0;
  Parser *in_stack_000004f8;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
  *in_stack_fffffffffffffe78;
  Token *in_stack_fffffffffffffe80;
  string *msg;
  AST *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 uVar4;
  _Alloc_hider in_stack_fffffffffffffebf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_110 [5];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffff18;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffff20;
  
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             0x1e8da6);
  parseArgs(in_stack_000004f8,in_stack_000004f0,in_stack_000004e8,in_stack_000004e0);
  local_110[0]._M_current =
       (ArgParam *)
       std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::begin
                 (in_stack_fffffffffffffe78);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::end
            (in_stack_fffffffffffffe78);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      Token::~Token(in_stack_fffffffffffffe80);
      return (ArgParams *)in_RDI;
    }
    pAVar2 = __gnu_cxx::
             __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
             ::operator*(local_110);
    if (pAVar2->id == (Identifier *)0x0) {
      if (pAVar2->expr->type != AST_VAR) {
        uVar4 = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        msg = (string *)&stack0xfffffffffffffebf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffec0,
                   (char *)CONCAT17(in_stack_fffffffffffffebf,
                                    CONCAT16(uVar4,in_stack_fffffffffffffeb8)),
                   (allocator<char> *)in_stack_fffffffffffffeb0);
        StaticError::StaticError(in_RSI,in_RDI,msg);
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      in_stack_fffffffffffffeb0 = pAVar2->expr;
      pAVar2->id = (Identifier *)in_stack_fffffffffffffeb0[1]._vptr_AST;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      pAVar2->expr = (AST *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
    ::operator++(local_110);
  } while( true );
}

Assistant:

ArgParams parseParams(const std::string &element_kind, bool &got_comma, Fodder &close_fodder)
    {
        ArgParams params;
        Token paren_r = parseArgs(params, element_kind, got_comma);

        // Check they're all identifiers
        // parseArgs returns f(x) with x as an expression.  Convert it here.
        for (auto &p : params) {
            if (p.id == nullptr) {
                if (p.expr->type != AST_VAR) {
                    throw StaticError(p.expr->location, "could not parse parameter here.");
                }
                auto *pv = static_cast<Var *>(p.expr);
                p.id = pv->id;
                p.idFodder = pv->openFodder;
                p.expr = nullptr;
            }
        }

        close_fodder = paren_r.fodder;

        return params;
    }